

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O1

bool __thiscall
TreePropagator::reachable
          (TreePropagator *this,int node,vector<bool,_std::allocator<bool>_> *blue,bool doDFS)

{
  __node_base_ptr *pp_Var1;
  uint uVar2;
  uint uVar3;
  BoolView *pBVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar6;
  bool bVar7;
  __node_base _Var8;
  size_t sVar9;
  ulong uVar10;
  int *pt;
  Clause *expl;
  vec<Lit> ps;
  vector<bool,_std::allocator<bool>_> pink;
  int count;
  Clause *local_d0;
  vec<Lit> local_c8;
  vector<bool,_std::allocator<bool>_> local_b8;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_90;
  ulong local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  long local_40;
  vec<TrailElem> *local_38;
  
  if ((int)CONCAT71(in_register_00000009,doDFS) != 0) {
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_90,
               (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_b8,
               (allocator_type *)&local_c8);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              (&blue->super__Bvector_base<std::allocator<bool>_>);
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         CONCAT44(local_90._M_rehash_policy._4_4_,local_90._M_rehash_policy._M_max_load_factor);
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_90._M_before_begin._M_nxt;
    *(size_type *)
     &(blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = local_90._M_element_count;
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_90._M_buckets;
    *(size_type *)
     &(blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = local_90._M_bucket_count;
    local_90._M_bucket_count = local_90._M_bucket_count & 0xffffffff00000000;
    local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_90._M_element_count = local_90._M_element_count & 0xffffffff00000000;
    local_90._M_buckets = (__buckets_ptr)((ulong)local_90._M_buckets & 0xffffffff00000000);
    DFSBlue(this,node,blue,(int *)&local_90);
  }
  uVar2 = (this->super_GraphPropagator).vs.sz;
  uVar5 = (ulong)uVar2;
  bVar7 = (int)uVar2 < 1;
  if (0 < (int)uVar2) {
    local_40 = (ulong)(uint)node << 4;
    local_38 = &engine.trail;
    uVar10 = 0;
    local_58 = (ulong)(uint)node;
    do {
      if ((1L << ((byte)uVar10 & 0x3f) &
          (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6]) == 0) {
        pBVar4 = (this->super_GraphPropagator).vs.data;
        if ((sat.assigns.data[(uint)pBVar4[uVar10].v] != '\0') &&
           ((uint)pBVar4[uVar10].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar4[uVar10].v])) {
          if (so.lazy != true) {
            return bVar7;
          }
          local_90._M_buckets = &local_90._M_single_bucket;
          local_90._M_bucket_count = 1;
          local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_90._M_element_count = 0;
          local_90._M_rehash_policy._M_max_load_factor = 1.0;
          local_90._M_rehash_policy._M_next_resize = 0;
          local_90._M_single_bucket = (__node_base_ptr)0x0;
          local_c8._0_8_ = (ulong)(uint7)local_c8._1_7_ << 8;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_b8,(long)(int)uVar5,(bool *)&local_c8,(allocator_type *)&local_d0);
          DFSPink(this,(int)uVar10,&local_b8,blue,
                  (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  &local_90);
          local_c8.sz = 0;
          local_c8.cap = 0;
          local_c8.data = (Lit *)0x0;
          uVar2 = (this->super_GraphPropagator).vs.data[local_58].v;
          local_d0 = (Clause *)
                     CONCAT44(local_d0._4_4_,
                              (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2);
          vec<Lit>::push(&local_c8,(Lit *)&local_d0);
          if (local_90._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            _Var8._M_nxt = local_90._M_before_begin._M_nxt;
            do {
              uVar2 = (this->super_GraphPropagator).es.data[*(uint *)&_Var8._M_nxt[1]._M_nxt].v;
              local_d0 = (Clause *)
                         CONCAT44(local_d0._4_4_,
                                  (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2
                                 );
              vec<Lit>::push(&local_c8,(Lit *)&local_d0);
              _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
            } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
          }
          uVar2 = (this->super_GraphPropagator).vs.data[uVar10].v;
          local_d0 = (Clause *)
                     CONCAT44(local_d0._4_4_,
                              (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2);
          vec<Lit>::push(&local_c8,(Lit *)&local_d0);
          uVar2 = local_c8.sz;
          uVar5 = local_c8._0_8_ & 0xffffffff;
          sVar9 = 8;
          if (local_c8.sz != 0) {
            sVar9 = (ulong)(local_c8.sz - 1) * 4 + 8;
          }
          local_d0 = (Clause *)malloc(sVar9);
          uVar3 = *(uint *)local_d0;
          local_d0->data[0].x = -2;
          *(uint *)local_d0 = uVar3 & 0xfc | uVar2 << 8;
          if (uVar2 != 0) {
            uVar10 = 0;
            do {
              local_d0->data[uVar10].x = local_c8.data[uVar10].x;
              uVar10 = uVar10 + 1;
            } while (uVar5 != uVar10);
          }
          *(byte *)local_d0 = *(byte *)local_d0 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_d0);
          sat.confl = local_d0;
          if (local_c8.data != (Lit *)0x0) {
            free(local_c8.data);
          }
          if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_90);
          return bVar7;
        }
        if (sat.assigns.data[(uint)(this->super_GraphPropagator).vs.data[uVar10].v] == '\0') {
          if (so.lazy == true) {
            local_90._M_buckets = &local_90._M_single_bucket;
            local_90._M_bucket_count = 1;
            local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_90._M_element_count = 0;
            local_90._M_rehash_policy._M_max_load_factor = 1.0;
            local_90._M_rehash_policy._M_next_resize = 0;
            local_90._M_single_bucket = (__node_base_ptr)0x0;
            local_c8._0_8_ = (ulong)(uint7)local_c8._1_7_ << 8;
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_b8,(long)(int)uVar5,(bool *)&local_c8,(allocator_type *)&local_d0);
            DFSPink(this,(int)uVar10,&local_b8,blue,
                    (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &local_90);
            local_c8.sz = 0;
            local_c8.cap = 0;
            local_c8.data = (Lit *)0x0;
            local_48 = blue;
            vec<Lit>::push(&local_c8);
            uVar2 = *(uint *)((long)&((this->super_GraphPropagator).vs.data)->v + local_40);
            local_d0 = (Clause *)
                       CONCAT44(local_d0._4_4_,
                                (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2);
            vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            for (_Var8._M_nxt = local_90._M_before_begin._M_nxt;
                _Var8._M_nxt != (_Hash_node_base *)0x0; _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
              uVar2 = (this->super_GraphPropagator).es.data[*(uint *)&_Var8._M_nxt[1]._M_nxt].v;
              local_d0 = (Clause *)
                         CONCAT44(local_d0._4_4_,
                                  (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2
                                 );
              vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            }
            uVar2 = local_c8.sz;
            uVar5 = local_c8._0_8_ & 0xffffffff;
            sVar9 = (ulong)(local_c8.sz - 1) * 4 + 8;
            if (local_c8.sz == 0) {
              sVar9 = 8;
            }
            local_d0 = (Clause *)malloc(sVar9);
            uVar3 = *(uint *)local_d0;
            local_d0->data[0].x = -2;
            *(uint *)local_d0 = uVar3 & 0xfc | uVar2 << 8;
            if (uVar2 != 0) {
              uVar6 = 0;
              do {
                local_d0->data[uVar6].x = local_c8.data[uVar6].x;
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
            *(byte *)local_d0 = *(byte *)local_d0 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_d0);
            blue = local_48;
            local_50._pt = local_d0;
            if (local_c8.data != (Lit *)0x0) {
              free(local_c8.data);
            }
            if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
              operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
            }
            std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_90);
            r = local_50;
          }
          else {
            r._pt = (Clause *)0x0;
          }
          pBVar4 = (this->super_GraphPropagator).vs.data;
          SAT::enqueue(&sat,(Lit)((pBVar4[uVar10].s ^ 1) + pBVar4[uVar10].v * 2),(Reason)r);
          pp_Var1 = (__node_base_ptr *)
                    ((this->last_state_n).super__Vector_base<Tint,_std::allocator<Tint>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar10);
          local_90._M_bucket_count = CONCAT44(4,*(undefined4 *)pp_Var1);
          local_90._M_buckets = pp_Var1;
          vec<TrailElem>::push(local_38,(TrailElem *)&local_90);
          *(undefined4 *)pp_Var1 = 1;
        }
      }
      uVar10 = uVar10 + 1;
      uVar5 = (ulong)(int)(this->super_GraphPropagator).vs.sz;
      bVar7 = (long)uVar5 <= (long)uVar10;
    } while ((long)uVar10 < (long)uVar5);
  }
  return bVar7;
}

Assistant:

bool TreePropagator::reachable(int node, std::vector<bool>& blue, bool doDFS) {
	if (doDFS) {
		blue = std::vector<bool>(nbNodes(), false);
		int count = 0;
		DFSBlue(node, blue, count);
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (blue[i] == false && getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] /\ any-fixed-not-visited => fail

				vec<Lit> ps;
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				assert(getNodeVar(i).isFixed());
				ps.push(getNodeVar(i).getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (blue[i] == false && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] => unfixed-not-visited = false

				vec<Lit> ps;
				ps.push();
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				r = Reason_new(ps);
			}
			// cout << "REACHABLE (N) "<<i<<endl;
			getNodeVar(i).setVal2(false, r);
			last_state_n[i] = VT_OUT;
		}
	}
	return true;
}